

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngwutil.c
# Opt level: O2

void png_write_compressed_data_out(png_structrp png_ptr,compression_state *comp)

{
  uint uVar1;
  png_byte *data;
  uInt uVar2;
  png_compression_bufferp ppVar3;
  
  uVar1 = comp->output_len;
  data = comp->output;
  ppVar3 = (png_compression_bufferp)&png_ptr->zbuffer_list;
  uVar2 = 0x400;
  while( true ) {
    ppVar3 = ppVar3->next;
    if (uVar1 <= uVar2) {
      uVar2 = uVar1;
    }
    png_write_chunk_data(png_ptr,data,(ulong)uVar2);
    uVar1 = uVar1 - uVar2;
    if ((uVar1 == 0) || (ppVar3 == (png_compression_bufferp)0x0)) break;
    uVar2 = png_ptr->zbuffer_size;
    data = ppVar3->output;
  }
  if (uVar1 == 0) {
    return;
  }
  png_error(png_ptr,"error writing ancillary chunked compressed data");
}

Assistant:

static void
png_write_compressed_data_out(png_structrp png_ptr, compression_state *comp)
{
   png_uint_32 output_len = comp->output_len;
   png_const_bytep output = comp->output;
   png_uint_32 avail = (sizeof comp->output);
   png_compression_buffer *next = png_ptr->zbuffer_list;

   for (;;)
   {
      if (avail > output_len)
         avail = output_len;

      png_write_chunk_data(png_ptr, output, avail);

      output_len -= avail;

      if (output_len == 0 || next == NULL)
         break;

      avail = png_ptr->zbuffer_size;
      output = next->output;
      next = next->next;
   }

   /* This is an internal error; 'next' must have been NULL! */
   if (output_len > 0)
      png_error(png_ptr, "error writing ancillary chunked compressed data");
}